

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void mulmod256(uint16_t *out,uint16_t *a,uint16_t *b,uint16_t *m)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int extraout_EDX;
  ulong uVar4;
  uint16_t sub;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ushort *puVar14;
  bool bVar15;
  uint16_t mul [32];
  uint16_t mul2 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (b == (uint16_t *)0x0) {
    local_98 = *(undefined8 *)(a + 8);
    uStack_90 = *(undefined8 *)(a + 0xc);
    local_a8 = *(undefined8 *)a;
    uStack_a0 = *(undefined8 *)(a + 4);
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    uVar3 = 0xff;
    do {
      if ((*(ushort *)((long)&local_a8 + (ulong)(uVar3 >> 4) * 2) >> (uVar3 & 0xf) & 1) != 0)
      goto LAB_0015fc82;
      bVar15 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar15);
  }
  else {
    iVar1 = 0;
    uVar6 = 0;
    uVar4 = 0;
    do {
      uVar9 = uVar4;
      iVar7 = (int)uVar6 + -0xf;
      if (uVar6 < 0x10) {
        iVar7 = 0;
      }
      if (iVar7 < 0x10) {
        uVar4 = 0xf;
        if ((long)uVar6 < 0xf) {
          uVar4 = uVar6;
        }
        lVar5 = (long)iVar7 + -1;
        puVar14 = b + -(long)iVar7;
        do {
          uVar9 = uVar9 + (ulong)*puVar14 * (ulong)a[lVar5 + 1];
          lVar5 = lVar5 + 1;
          puVar14 = puVar14 + -1;
        } while (lVar5 < (long)uVar4);
      }
      *(short *)((long)&local_a8 + uVar6 * 2) = (short)uVar9;
      uVar6 = uVar6 + 1;
      b = b + 1;
      uVar4 = uVar9 >> 0x10;
    } while (uVar6 != 0x20);
    if (0xffff < uVar9) {
      mulmod256_cold_1();
      if (iVar1 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (uint)(a[0xf] >> 0xf);
      }
      iVar1 = extraout_EDX + 0xf0;
      lVar5 = 0xf;
      do {
        uVar8 = 0;
        iVar7 = 0;
        do {
          uVar12 = iVar1 + iVar7;
          uVar10 = uVar3;
          if ((int)uVar12 < 0x100) {
            uVar10 = (uint)((a[(int)uVar12 >> 4] >> (uVar12 & 0xf) & 1) != 0);
          }
          uVar8 = uVar8 | uVar10 << ((byte)iVar7 & 0x1f);
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0x10);
        out[lVar5] = (uint16_t)uVar8;
        iVar1 = iVar1 + -0x10;
        bVar15 = lVar5 != 0;
        lVar5 = lVar5 + -1;
      } while (bVar15);
      return;
    }
    uVar3 = 0x1ff;
    do {
      if ((*(ushort *)((long)&local_a8 + (ulong)(uVar3 >> 4) * 2) >> (uVar3 & 0xf) & 1) != 0)
      goto LAB_0015fc82;
      bVar15 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar15);
  }
  uVar3 = 0;
LAB_0015fc82:
  if (m != (uint16_t *)0x0) {
    uVar4 = 0x100;
    do {
      uVar6 = uVar4 - 1;
      if ((m[uVar6 >> 4 & 0xfffffff] >> ((uint)uVar6 & 0xf) & 1) != 0) break;
      iVar1 = (int)uVar4;
      uVar4 = uVar6;
    } while (iVar1 != 1);
    if ((int)(uint)uVar6 <= (int)uVar3) {
      uVar4 = -uVar3 + uVar6;
      lVar5 = uVar3 - uVar6;
      do {
        uVar9 = uVar4 & 0xffffffff;
        lVar11 = 0;
        lVar13 = 0;
        do {
          iVar1 = 0;
          uVar2 = 0;
          do {
            uVar3 = (int)uVar9 + iVar1;
            if (uVar3 < 0x100) {
              uVar2 = (ulong)((uint)uVar2 |
                             (uint)((m[uVar3 >> 4] >> (uVar3 & 0xf) & 1) != 0) <<
                             ((byte)iVar1 & 0x1f));
            }
            iVar1 = iVar1 + 1;
          } while (iVar1 != 0x10);
          uVar2 = (lVar13 - (uVar2 & 0xffff)) + (ulong)*(ushort *)((long)&local_a8 + lVar11 * 2);
          *(short *)((long)&local_68 + lVar11 * 2) = (short)uVar2;
          lVar13 = (long)uVar2 >> 0x10;
          lVar11 = lVar11 + 1;
          uVar9 = (ulong)((int)uVar9 + 0x10);
        } while (lVar11 != 0x20);
        if (uVar2 < 0x10000) {
          local_78 = local_38;
          uStack_70 = uStack_30;
          local_88 = local_48;
          uStack_80 = uStack_40;
          local_98 = local_58;
          uStack_90 = uStack_50;
          local_a8 = local_68;
          uStack_a0 = uStack_60;
        }
        uVar4 = (ulong)((int)uVar4 + 1);
        bVar15 = 0 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar15);
    }
    uVar6 = uVar6 >> 4;
    do {
      uVar6 = uVar6 + 1;
      if (uVar6 == 0x20) goto LAB_0015fd92;
    } while (*(short *)((long)&local_a8 + uVar6 * 2) == 0);
    mulmod256_cold_2();
  }
LAB_0015fd92:
  *(undefined8 *)(out + 8) = local_98;
  *(undefined8 *)(out + 0xc) = uStack_90;
  *(undefined8 *)out = local_a8;
  *(undefined8 *)(out + 4) = uStack_a0;
  return;
}

Assistant:

static void mulmod256(uint16_t* out, const uint16_t* a, const uint16_t* b, const uint16_t* m) {
    uint16_t mul[32];
    uint64_t c = 0;
    int i, j;
    int m_bitlen = 0;
    int mul_bitlen = 0;

    if (b != NULL) {
        /* Compute the product of a and b, and put it in mul. */
        for (i = 0; i < 32; ++i) {
            for (j = i <= 15 ? 0 : i - 15; j <= i && j <= 15; j++) {
                c += (uint64_t)a[j] * b[i - j];
            }
            mul[i] = c & 0xFFFF;
            c >>= 16;
        }
        CHECK(c == 0);

        /* compute the highest set bit in mul */
        for (i = 511; i >= 0; --i) {
            if ((mul[i >> 4] >> (i & 15)) & 1) {
                mul_bitlen = i;
                break;
            }
        }
    } else {
        /* if b==NULL, set mul=a. */
        memcpy(mul, a, 32);
        memset(mul + 16, 0, 32);
        /* compute the highest set bit in mul */
        for (i = 255; i >= 0; --i) {
            if ((mul[i >> 4] >> (i & 15)) & 1) {
                mul_bitlen = i;
                break;
            }
        }
    }

    if (m) {
        /* Compute the highest set bit in m. */
        for (i = 255; i >= 0; --i) {
            if ((m[i >> 4] >> (i & 15)) & 1) {
                m_bitlen = i;
                break;
            }
        }

        /* Try do mul -= m<<i, for i going down to 0, whenever the result is not negative */
        for (i = mul_bitlen - m_bitlen; i >= 0; --i) {
            uint16_t mul2[32];
            int64_t cs;

            /* Compute mul2 = mul - m<<i. */
            cs = 0; /* accumulator */
            for (j = 0; j < 32; ++j) { /* j loops over the output limbs in mul2. */
                /* Compute sub: the 16 bits in m that will be subtracted from mul2[j]. */
                uint16_t sub = 0;
                int p;
                for (p = 0; p < 16; ++p) { /* p loops over the bit positions in mul2[j]. */
                    int bitpos = j * 16 - i + p; /* bitpos is the correspond bit position in m. */
                    if (bitpos >= 0 && bitpos < 256) {
                        sub |= ((m[bitpos >> 4] >> (bitpos & 15)) & 1) << p;
                    }
                }
                /* Add mul[j]-sub to accumulator, and shift bottom 16 bits out to mul2[j]. */
                cs += mul[j];
                cs -= sub;
                mul2[j] = (cs & 0xFFFF);
                cs >>= 16;
            }
            /* If remainder of subtraction is 0, set mul = mul2. */
            if (cs == 0) {
                memcpy(mul, mul2, sizeof(mul));
            }
        }
        /* Sanity check: test that all limbs higher than m's highest are zero */
        for (i = (m_bitlen >> 4) + 1; i < 32; ++i) {
            CHECK(mul[i] == 0);
        }
    }
    memcpy(out, mul, 32);
}